

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall
HFactor::btranL(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  double dVar1;
  int iVar2;
  int iVar3;
  HighsInt *h_start;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer piVar9;
  HighsInt factor_clock;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  HighsInt k;
  ulong uVar13;
  long lVar14;
  FactorTimer factor_timer;
  
  FactorTimer::start(&factor_timer,0x1a,factor_timer_clock_pointer);
  if (((expected_density <= 0.1) && (-1 < rhs->count)) &&
     ((double)rhs->count * this->inv_num_row <= 0.05)) {
    factor_clock = 0x1d;
    FactorTimer::start(&factor_timer,0x1d,factor_timer_clock_pointer);
    h_start = (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    solveHyper(this->num_row,
               (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,(double *)0x0,h_start,h_start + 1,
               (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,rhs);
LAB_00356ed5:
    FactorTimer::stop(&factor_timer,factor_clock,factor_timer_clock_pointer);
    if (this->update_method == 4) {
      FactorTimer::start(&factor_timer,0x1e,factor_timer_clock_pointer);
      btranAPF(this,rhs);
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
      FactorTimer::stop(&factor_timer,0x1e,factor_timer_clock_pointer);
    }
    FactorTimer::stop(&factor_timer,0x1a,factor_timer_clock_pointer);
    return;
  }
  factor_clock = 0x1c;
  FactorTimer::start(&factor_timer,0x1c,factor_timer_clock_pointer);
  piVar4 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (ulong)(uint)this->num_row;
  piVar9 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  do {
    uVar13 = uVar10 & 0xffffffff;
    uVar11 = uVar10;
    while( true ) {
      uVar10 = uVar11 - 1;
      if ((int)uVar13 < 1) {
        rhs->count = (int)uVar12;
        goto LAB_00356ed5;
      }
      iVar2 = piVar9[uVar10];
      dVar1 = pdVar5[iVar2];
      if (1e-14 < ABS(dVar1)) break;
      pdVar5[iVar2] = 0.0;
      uVar13 = (ulong)((int)uVar13 - 1);
      uVar11 = uVar10;
    }
    piVar4[uVar12] = iVar2;
    iVar2 = piVar6[uVar11];
    for (lVar14 = (long)piVar6[uVar10]; lVar14 < iVar2; lVar14 = lVar14 + 1) {
      iVar3 = piVar7[lVar14];
      pdVar5[iVar3] = pdVar8[lVar14] * -dVar1 + pdVar5[iVar3];
    }
    uVar12 = (ulong)((int)uVar12 + 1);
  } while( true );
}

Assistant:

void HFactor::btranL(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  FactorTimer factor_timer;
  factor_timer.start(FactorBtranLower, factor_timer_clock_pointer);

  // Determine style of solve
  const double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperBtranL;
  if (sparse_solve) {
    factor_timer.start(FactorBtranLowerSps, factor_timer_clock_pointer);
    // Alias to RHS
    HighsInt* rhs_index = rhs.index.data();
    double* rhs_array = rhs.array.data();
    // Alias to factor L
    const HighsInt* lr_start = this->lr_start.data();
    const HighsInt* lr_index = this->lr_index.data();
    const double* lr_value = this->lr_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    for (HighsInt i = num_row - 1; i >= 0; i--) {
      HighsInt pivotRow = l_pivot_index[i];
      const double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        rhs_index[rhs_count++] = pivotRow;
        rhs_array[pivotRow] = pivot_multiplier;
        const HighsInt start = lr_start[i];
        const HighsInt end = lr_start[i + 1];
        for (HighsInt k = start; k < end; k++)
          rhs_array[lr_index[k]] -= pivot_multiplier * lr_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    factor_timer.stop(FactorBtranLowerSps, factor_timer_clock_pointer);
  } else {
    // Hyper-sparse solve
    factor_timer.start(FactorBtranLowerHyper, factor_timer_clock_pointer);
    const HighsInt* lr_index = this->lr_index.data();
    const double* lr_value = this->lr_value.data();
    solveHyper(num_row, l_pivot_lookup.data(), l_pivot_index.data(), 0,
               lr_start.data(), &lr_start[1], &lr_index[0], &lr_value[0], &rhs);
    factor_timer.stop(FactorBtranLowerHyper, factor_timer_clock_pointer);
  }

  if (update_method == kUpdateMethodApf) {
    factor_timer.start(FactorBtranLowerAPF, factor_timer_clock_pointer);
    btranAPF(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorBtranLowerAPF, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorBtranLower, factor_timer_clock_pointer);
}